

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleForth.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  string res2;
  string line;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  ifstream t;
  undefined8 auStack_950 [36];
  Forth forth;
  
  cppforth::Forth::Forth(&forth);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t,"",(allocator<char> *)&line);
  cppforth::Forth::SetExecutionInputBuffer(&forth,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  forth.readFromSource = FromStdCin;
  forth.writeToTarget = ToStdCout;
  std::__cxx11::string::string<std::allocator<char>>((string *)&line," ",(allocator<char> *)&t);
  res2._M_dataplus._M_p = (pointer)&res2.field_2;
  res2._M_string_length = 0;
  res2.field_2._M_local_buf[0] = '\0';
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    std::ifstream::ifstream(&t,argv[lVar2],_S_in);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&str,*(undefined8 *)((long)auStack_950 + *(long *)(_t + -0x18)),0xffffffff,
               0,0xffffffff);
    cppforth::Forth::ExecuteString(&forth,&str);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&res2,&local_a58);
    std::__cxx11::string::~string((string *)&local_a58);
    cppforth::Forth::ExecutionOutputReset(&forth);
    std::__cxx11::string::~string((string *)&str);
    std::ifstream::~ifstream(&t);
  }
  while (forth.isBye == false) {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<(poVar1,">");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&line);
    cppforth::Forth::ExecuteString(&forth,&line);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&res2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&t);
    std::__cxx11::string::~string((string *)&t);
    std::operator<<((ostream *)&std::cout,(string *)&res2);
    cppforth::Forth::ExecutionOutputReset(&forth);
    res2._M_string_length = 0;
    *res2._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::~string((string *)&res2);
  std::__cxx11::string::~string((string *)&line);
  cppforth::Forth::~Forth(&forth);
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
	try {
		cppforth::Forth forth{};
		forth.SetExecutionInputBuffer("");
		forth.setInputSource(cppforth::Forth::FromStdCin);
		forth.setWriteTarget(cppforth::Forth::ToStdCout);

		std::string line{ " " }, res2{};
		for(int i=1;i<argc;++i){
			std::ifstream t(argv[i]);
                        std::string str((std::istreambuf_iterator<char>(t)),
                         std::istreambuf_iterator<char>());
			forth.ExecuteString(str);
			res2 = forth.ExecutionOutput();
			forth.ExecutionOutputReset();
		}
		while (!forth.isFinished()){
			std::cout << std::endl << ">" ;
 			std::getline(std::cin, line);
			try {
				forth.ExecuteString(line);
				res2 = forth.ExecutionOutput();
				std::cout << res2;
			}
			catch (cppforth::Forth::AbortException &ex){
				const char *errorMessage = ex.what();
				std::cout << "Forth exception " << errorMessage << std::endl;
			}
			forth.ExecutionOutputReset();
			res2.clear();
		}
	}
	catch (cppforth::Forth::AbortException &ex){
		const char *errorMessage = ex.what();
         	std::cout << "Forth exception "<<errorMessage<<std::endl;
	}
	catch (std::exception &ex){
		const char *errorMessage = ex.what();
         	std::cout << "C++ exception "<<errorMessage<<std::endl;
	}
	catch (...){
         	std::cout << "Unknown C++ exception "<<std::endl;
	}
	return 0;
}